

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff.cxx
# Opt level: O2

void __thiscall vigra::TIFFDecoderImpl::nextScanline(TIFFDecoderImpl *this)

{
  byte *pbVar1;
  TIFF *pTVar2;
  tdata_t pvVar3;
  bool bVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint i;
  ulong uVar9;
  
  uVar6 = (this->super_TIFFCodecImpl).stripindex + 1;
  (this->super_TIFFCodecImpl).stripindex = uVar6;
  if ((this->super_TIFFCodecImpl).stripheight <= uVar6) {
    (this->super_TIFFCodecImpl).stripindex = 0;
    pTVar2 = (this->super_TIFFCodecImpl).tiff;
    if ((this->super_TIFFCodecImpl).planarconfig == 2) {
      TIFFScanlineSize();
      for (uVar9 = 0; uVar5 = (this->super_TIFFCodecImpl).samples_per_pixel, uVar9 < uVar5;
          uVar9 = uVar9 + 1) {
        pTVar2 = (this->super_TIFFCodecImpl).tiff;
        pvVar3 = (this->super_TIFFCodecImpl).stripbuffer[uVar9];
        this->scanline = this->scanline + 1;
        TIFFReadScanline(pTVar2,pvVar3);
      }
    }
    else {
      pvVar3 = *(this->super_TIFFCodecImpl).stripbuffer;
      this->scanline = this->scanline + 1;
      TIFFReadScanline(pTVar2,pvVar3);
      uVar5 = (this->super_TIFFCodecImpl).samples_per_pixel;
    }
    if ((((this->super_TIFFCodecImpl).photometric == 0) && (uVar5 == 1)) &&
       (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )this,"UINT8"), bVar4)) {
      pvVar3 = *(this->super_TIFFCodecImpl).stripbuffer;
      iVar7 = TIFFScanlineSize((this->super_TIFFCodecImpl).tiff);
      for (lVar8 = 0; iVar7 != (int)lVar8; lVar8 = lVar8 + 1) {
        pbVar1 = (byte *)((long)pvVar3 + lVar8);
        *pbVar1 = ~*pbVar1;
      }
    }
  }
  return;
}

Assistant:

void TIFFDecoderImpl::nextScanline()
    {
        // eventually read a new strip
        if ( ++stripindex >= stripheight ) {
            stripindex = 0;

            if ( planarconfig == PLANARCONFIG_SEPARATE ) {
                const tsize_t size = TIFFScanlineSize(tiff);
                for( unsigned int i = 0; i < samples_per_pixel; ++i )
                    TIFFReadScanline(tiff, stripbuffer[i], scanline++, size);
            } else {
                TIFFReadScanline( tiff, stripbuffer[0], scanline++, 0);
            }

            // XXX handle bilevel images

            // invert grayscale images that interpret 0 as white
            if ( photometric == PHOTOMETRIC_MINISWHITE &&
                 samples_per_pixel == 1 && pixeltype == "UINT8" ) {

                UInt8 * buf = static_cast< UInt8 * >(stripbuffer[0]);
                const unsigned int n = TIFFScanlineSize(tiff);

                // invert every pixel
                for ( unsigned int i = 0; i < n; ++i, ++buf )
                    *buf = 0xff - *buf;
            }
        }
    }